

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_scc_8_ix(void)

{
  uint address;
  uint value;
  
  address = m68ki_get_ea_ix(m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8]);
  value = 0;
  if ((m68ki_cpu.c_flag & 0x100) == 0) {
    value = 0xff;
  }
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,value);
  return;
}

Assistant:

static void m68k_op_scc_8_ix(void)
{
	m68ki_write_8(EA_AY_IX_8(), COND_CC() ? 0xff : 0);
}